

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O2

bool __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::Uint(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
       *this,uint i)

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar1;
  
  pGVar1 = internal::Stack<rapidjson::CrtAllocator>::
           Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                     (&this->stack_,1);
  (pGVar1->data_).s.str = (Ch *)0x0;
  *(ulong *)&pGVar1->data_ = (ulong)i;
  (pGVar1->data_).f.flags = (ushort)(-1 < (int)i) << 5 | 0x1d6;
  return true;
}

Assistant:

bool Uint(unsigned i) { new (stack_.template Push<ValueType>()) ValueType(i); return true; }